

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O1

int Gia_ManCofOneDerive(Ccf_Man_t *p,int LitProp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *p_00;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  
  pVVar4 = p->vCopies;
  uVar15 = p->pFrames->nObjs;
  if (pVVar4->nCap < (int)uVar15) {
    if (pVVar4->pArray == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar15 << 2);
    }
    else {
      piVar8 = (int *)realloc(pVVar4->pArray,(long)(int)uVar15 << 2);
    }
    pVVar4->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar15;
  }
  if (0 < (int)uVar15) {
    memset(pVVar4->pArray,0xff,(ulong)uVar15 * 4);
  }
  pVVar4->nSize = uVar15;
  if (LitProp < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar15 = (uint)LitProp >> 1;
  Gia_ManCofOneDerive_rec(p,uVar15);
  if (p->vCopies->nSize <= (int)uVar15) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar15 = p->vCopies->pArray[uVar15];
  if ((int)uVar15 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  p_00 = p->pFrames;
  uVar12 = uVar15 >> 1;
  uVar1 = p_00->nObjs;
  if ((int)uVar1 <= (int)uVar12) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  if ((~*(uint *)(p_00->pObjs + uVar12) & 0x1fffffff) == 0 ||
      -1 < (int)*(uint *)(p_00->pObjs + uVar12)) {
    uVar2 = p_00->nObjsAlloc;
    if (uVar1 == uVar2) {
      uVar7 = uVar2 * 2;
      if (0x1fffffff < (int)(uVar2 * 2)) {
        uVar7 = 0x20000000;
      }
      if (uVar1 == 0x20000000) {
        puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
        exit(1);
      }
      if ((int)uVar7 <= (int)uVar1) {
        __assert_fail("p->nObjs < nObjNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x289,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      if (p_00->fVerbose != 0) {
        printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar7);
      }
      if (p_00->nObjsAlloc < 1) {
        __assert_fail("p->nObjsAlloc > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x28c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      lVar14 = (long)(int)uVar7;
      if (p_00->pObjs == (Gia_Obj_t *)0x0) {
        pGVar9 = (Gia_Obj_t *)malloc(lVar14 * 0xc);
      }
      else {
        pGVar9 = (Gia_Obj_t *)realloc(p_00->pObjs,lVar14 * 0xc);
      }
      p_00->pObjs = pGVar9;
      memset(pGVar9 + p_00->nObjsAlloc,0,(lVar14 - p_00->nObjsAlloc) * 0xc);
      if (p_00->pMuxes != (uint *)0x0) {
        puVar10 = (uint *)realloc(p_00->pMuxes,lVar14 * 4);
        p_00->pMuxes = puVar10;
        memset(puVar10 + p_00->nObjsAlloc,0,(lVar14 - p_00->nObjsAlloc) * 4);
      }
      p_00->nObjsAlloc = uVar7;
    }
    if ((p_00->vHTable).nSize != 0) {
      Vec_IntPush(&p_00->vHash,0);
    }
    iVar3 = p_00->nObjs;
    p_00->nObjs = iVar3 + 1;
    if (-1 < (long)iVar3) {
      pGVar9 = p_00->pObjs + iVar3;
      uVar5 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar5 | 0x80000000;
      pGVar6 = p_00->pObjs;
      if ((pGVar6 <= pGVar9) && (pGVar9 < pGVar6 + p_00->nObjs)) {
        uVar15 = uVar15 ^ LitProp & 1U;
        uVar11 = (ulong)(((uint)((int)pGVar9 - (int)pGVar6) >> 2) * -0x55555555 - uVar12 &
                        0x1fffffff);
        uVar13 = (ulong)((uVar15 & 1) << 0x1d);
        *(ulong *)pGVar9 = uVar13 | uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar11;
        *(ulong *)pGVar9 =
             uVar13 | uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar6 = p_00->pObjs;
        if ((pGVar6 <= pGVar9) && (pGVar9 < pGVar6 + p_00->nObjs)) {
          Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar9 - (long)pGVar6) >> 2) * -0x55555555);
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9
                            );
          }
          if ((p_00->pObjs <= pGVar9) && (pGVar9 < p_00->pObjs + p_00->nObjs)) {
            Gia_ManCofExtendSolver(p);
            return uVar15 ^ 1;
          }
        }
      }
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManCofOneDerive( Ccf_Man_t * p, int LitProp )
{
    int LitOut;
    // derive the cofactor of the property node
    Vec_IntFill( p->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    Gia_ManCofOneDerive_rec( p, Abc_Lit2Var(LitProp) );
    LitOut = Vec_IntEntry( p->vCopies, Abc_Lit2Var(LitProp) );
    LitOut = Abc_LitNotCond( LitOut, Abc_LitIsCompl(LitProp) );
    // add new PO for the cofactor
    Gia_ManAppendCo( p->pFrames, LitOut );
    // add SAT clauses
    Gia_ManCofExtendSolver( p );
    // return negative literal of the cofactor
    return Abc_LitNot(LitOut);
}